

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lhash.cc
# Opt level: O3

void OPENSSL_lh_doall_arg(_LHASH *lh,_func_void_void_ptr_void_ptr *func,void *arg)

{
  void **ppvVar1;
  ulong uVar2;
  uint uVar3;
  ulong uVar4;
  LHASH_ITEM *pLVar5;
  
  if (lh != (_LHASH *)0x0) {
    if (lh->callback_depth == 0xffffffff) {
      uVar3 = 0xffffffff;
    }
    else {
      uVar3 = lh->callback_depth + 1;
      lh->callback_depth = uVar3;
    }
    uVar2 = lh->num_buckets;
    if (uVar2 != 0) {
      uVar4 = 0;
      do {
        pLVar5 = lh->buckets[uVar4];
        if (pLVar5 != (LHASH_ITEM *)0x0) {
          do {
            ppvVar1 = &pLVar5->data;
            pLVar5 = pLVar5->next;
            (*func)(*ppvVar1,arg);
          } while (pLVar5 != (lhash_item_st *)0x0);
          uVar2 = lh->num_buckets;
        }
        uVar4 = uVar4 + 1;
      } while (uVar4 < uVar2);
      uVar3 = lh->callback_depth;
    }
    if (uVar3 != 0xffffffff) {
      lh->callback_depth = uVar3 - 1;
    }
    lh_maybe_resize(lh);
    return;
  }
  return;
}

Assistant:

void OPENSSL_lh_doall_arg(_LHASH *lh, void (*func)(void *, void *), void *arg) {
  if (lh == NULL) {
    return;
  }

  if (lh->callback_depth < UINT_MAX) {
    // |callback_depth| is a saturating counter.
    lh->callback_depth++;
  }

  for (size_t i = 0; i < lh->num_buckets; i++) {
    LHASH_ITEM *next;
    for (LHASH_ITEM *cur = lh->buckets[i]; cur != NULL; cur = next) {
      next = cur->next;
      func(cur->data, arg);
    }
  }

  if (lh->callback_depth < UINT_MAX) {
    lh->callback_depth--;
  }

  // The callback may have added or removed elements and the non-zero value of
  // |callback_depth| will have suppressed any resizing. Thus any needed
  // resizing is done here.
  lh_maybe_resize(lh);
}